

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmtoau.c
# Opt level: O1

void puts_uint32_be(uint32_t i)

{
  putchar((int)i >> 0x18);
  putchar((int)(char)(i >> 0x10));
  putchar((int)(char)(i >> 8));
  putchar((int)(char)i);
  return;
}

Assistant:

void puts_uint32_be(uint32_t i) {
	char* c = (char*)(&i);

	if(XM_BIG_ENDIAN) {
		putchar(c[0]);
		putchar(c[1]);
		putchar(c[2]);
		putchar(c[3]);
	} else {
		putchar(c[3]);
		putchar(c[2]);
		putchar(c[1]);
		putchar(c[0]);
	}
}